

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::mergeQualifiers(HlslParseContext *this,TQualifier *dst,TQualifier *src)

{
  TQualifier *src_local;
  TQualifier *dst_local;
  HlslParseContext *this_local;
  
  if (((*(ulong *)&dst->field_0x8 & 0x7f) == 0) ||
     (((uint)*(undefined8 *)&dst->field_0x8 & 0x7f) == 1)) {
    *(ulong *)&dst->field_0x8 =
         *(ulong *)&dst->field_0x8 & 0xffffffffffffff80 |
         (ulong)((uint)*(undefined8 *)&src->field_0x8 & 0x7f);
  }
  else if (((((uint)*(undefined8 *)&dst->field_0x8 & 0x7f) == 0x10) &&
           (((uint)*(undefined8 *)&src->field_0x8 & 0x7f) == 0x11)) ||
          ((((uint)*(undefined8 *)&dst->field_0x8 & 0x7f) == 0x11 &&
           (((uint)*(undefined8 *)&src->field_0x8 & 0x7f) == 0x10)))) {
    *(ulong *)&dst->field_0x8 = *(ulong *)&dst->field_0x8 & 0xffffffffffffff80 | 0x12;
  }
  else if (((((uint)*(undefined8 *)&dst->field_0x8 & 0x7f) == 0x10) &&
           (((uint)*(undefined8 *)&src->field_0x8 & 0x7f) == 2)) ||
          ((((uint)*(undefined8 *)&dst->field_0x8 & 0x7f) == 2 &&
           (((uint)*(undefined8 *)&src->field_0x8 & 0x7f) == 0x10)))) {
    *(ulong *)&dst->field_0x8 = *(ulong *)&dst->field_0x8 & 0xffffffffffffff80 | 0x13;
  }
  mergeObjectLayoutQualifiers(this,dst,src,false);
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffffffffefffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x1c & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x1c & 1) != 0) << 0x1c;
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffffffefffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x24 & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x24 & 1) != 0) << 0x24;
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffffffffdfffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x1d & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x1d & 1) != 0) << 0x1d;
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffffffffbfffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x1e & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x1e & 1) != 0) << 0x1e;
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffffffff7fffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x1f & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x1f & 1) != 0) << 0x1f;
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffffffdfffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x25 & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x25 & 1) != 0) << 0x25;
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffffefffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x2c & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x2c & 1) != 0) << 0x2c;
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffffdfffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x2d & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x2d & 1) != 0) << 0x2d;
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xfffdffffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x31 & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x31 & 1) != 0) << 0x31;
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xfffbffffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x32 & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x32 & 1) != 0) << 0x32;
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffffbfffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x2e & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x2e & 1) != 0) << 0x2e;
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xffff7fffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x2f & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x2f & 1) != 0) << 0x2f;
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xfffeffffffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 & 0x1000000000000) != 0 ||
              (*(ulong *)&src->field_0x8 & 0x1000000000000) != 0) << 0x30;
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xfffffffeffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 & 0x100000000) != 0 ||
              (*(ulong *)&src->field_0x8 & 0x100000000) != 0) << 0x20;
  *(ulong *)&dst->field_0x8 =
       *(ulong *)&dst->field_0x8 & 0xfffffffdffffffff |
       (ulong)((*(ulong *)&dst->field_0x8 >> 0x21 & 1) != 0 ||
              (*(ulong *)&src->field_0x8 >> 0x21 & 1) != 0) << 0x21;
  return;
}

Assistant:

void HlslParseContext::mergeQualifiers(TQualifier& dst, const TQualifier& src)
{
    // Storage qualification
    if (dst.storage == EvqTemporary || dst.storage == EvqGlobal)
        dst.storage = src.storage;
    else if ((dst.storage == EvqIn  && src.storage == EvqOut) ||
             (dst.storage == EvqOut && src.storage == EvqIn))
        dst.storage = EvqInOut;
    else if ((dst.storage == EvqIn    && src.storage == EvqConst) ||
             (dst.storage == EvqConst && src.storage == EvqIn))
        dst.storage = EvqConstReadOnly;

    // Layout qualifiers
    mergeObjectLayoutQualifiers(dst, src, false);

    // individual qualifiers
#define MERGE_SINGLETON(field) dst.field |= src.field;
    MERGE_SINGLETON(invariant);
    MERGE_SINGLETON(noContraction);
    MERGE_SINGLETON(centroid);
    MERGE_SINGLETON(smooth);
    MERGE_SINGLETON(flat);
    MERGE_SINGLETON(nopersp);
    MERGE_SINGLETON(patch);
    MERGE_SINGLETON(sample);
    MERGE_SINGLETON(coherent);
    MERGE_SINGLETON(volatil);
    MERGE_SINGLETON(restrict);
    MERGE_SINGLETON(readonly);
    MERGE_SINGLETON(writeonly);
    MERGE_SINGLETON(specConstant);
    MERGE_SINGLETON(nonUniform);
}